

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::Crop_x86_fma::forward(Crop_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  void *pvVar4;
  Allocator *pAVar5;
  ulong uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  bool bVar27;
  pointer pMVar28;
  int iVar29;
  int iVar30;
  sbyte sVar31;
  int iVar32;
  size_t sVar33;
  Mat *pMVar34;
  long lVar35;
  uint uVar36;
  int iVar37;
  ulong uVar38;
  long lVar39;
  bool bVar40;
  bool bVar41;
  int _outw;
  Mat m;
  int _outh;
  int _woffset;
  uint local_128;
  int _outc;
  int _outd;
  int _hoffset;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blob_shapes;
  int iStack_100;
  Allocator *local_f8;
  undefined8 uStack_f0;
  int iStack_e8;
  int iStack_e4;
  int iStack_e0;
  size_t local_d8;
  int _coffset;
  size_t local_b0;
  ulong local_a8;
  uint local_9c;
  Mat m_2;
  int _doffset;
  
  local_128 = bottom_blob->w;
  uVar1 = bottom_blob->h;
  iVar30 = bottom_blob->d;
  local_9c = bottom_blob->c;
  pMVar34 = (Mat *)(ulong)local_9c;
  uVar36 = bottom_blob->dims;
  local_a8 = (ulong)uVar36;
  local_b0 = bottom_blob->elemsize;
  iVar2 = bottom_blob->elempack;
  if (((this->super_Crop).starts_expr._M_string_length == 0) ||
     ((this->super_Crop).ends_expr._M_string_length == 0)) {
    if (uVar36 - 1 < 4) {
      lVar39 = (long)(int)local_128;
      m.w = local_128;
      switch(uVar36) {
      case 1:
        m.w = iVar2 * local_128;
        m.dims = 1;
        m.h = 1;
        m.d = 1;
        m.c = 1;
        m.cstep = (size_t)m.w;
        goto LAB_00288e00;
      case 2:
        m.h = iVar2 * uVar1;
        m.elemsize._0_4_ = 4;
        m.elempack = 1;
        m.dims = 2;
        m.d = 1;
        m.c = 1;
        m.cstep = m.h * lVar39;
        goto LAB_00288e8f;
      case 3:
        m.dims = 3;
        m.d = 1;
        lVar39 = (int)uVar1 * lVar39;
        break;
      case 4:
        m.dims = 4;
        lVar39 = (int)uVar1 * lVar39 * (long)iVar30;
        m.d = iVar30;
      }
      m.c = iVar2 * local_9c;
      m.cstep = lVar39 + 3U & 0x3ffffffffffffffc;
      m.h = uVar1;
LAB_00288e00:
      m.elemsize._0_4_ = 4;
      m.elempack = 1;
    }
    else {
      m.cstep = 0;
      m.elemsize._0_4_ = 0;
      m.elempack = 0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
    }
LAB_00288e8f:
    m.elemsize._4_4_ = 0;
    m.refcount._4_4_ = 0;
    m.refcount._0_4_ = 0;
    m.allocator = (Allocator *)0x0;
    m.data = (void *)0x0;
    Crop::resolve_crop_roi
              (&this->super_Crop,&m,&_woffset,&_hoffset,&_doffset,&_coffset,&_outw,&_outh,&_outd,
               &_outc);
    piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    goto LAB_002891ac;
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (&bottom_blob_shapes,1,(allocator_type *)&m);
  pMVar28 = bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start;
  switch(bottom_blob->dims) {
  case 1:
    m.cstep = (long)bottom_blob->elempack * (long)bottom_blob->w;
    m.elemsize._0_4_ = 4;
    m.elempack = 1;
    m.dims = 1;
    m.w = (int)m.cstep;
    m.h = 1;
    m.d = 1;
    m.c = 1;
    break;
  case 2:
    m.w = bottom_blob->w;
    lVar39 = (long)bottom_blob->elempack * (long)bottom_blob->h;
    m.elemsize._0_4_ = 4;
    m.elempack = 1;
    m.dims = 2;
    m.h = (int)lVar39;
    m.d = 1;
    m.c = 1;
    m.cstep = lVar39 * m.w;
    break;
  case 3:
    m.w = bottom_blob->w;
    m.h = bottom_blob->h;
    m.c = bottom_blob->elempack * bottom_blob->c;
    m.dims = 3;
    m.d = 1;
    lVar39 = (long)m.h * (long)m.w;
    goto LAB_00288fbc;
  case 4:
    m.w = bottom_blob->w;
    m.h = bottom_blob->h;
    m.d = bottom_blob->d;
    m.c = bottom_blob->elempack * bottom_blob->c;
    m.dims = 4;
    lVar39 = (long)m.h * (long)m.w * (long)m.d;
LAB_00288fbc:
    m.elempack = 1;
    m.elemsize._0_4_ = 4;
    m.cstep = lVar39 + 3U & 0x3ffffffffffffffc;
    break;
  default:
    m.cstep = 0;
    m.elemsize._0_4_ = 0;
    m.elempack = 0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
  }
  m.elemsize._4_4_ = 0;
  m.refcount._4_4_ = 0;
  m.refcount._0_4_ = 0;
  m.allocator = (Allocator *)0x0;
  m.data = (void *)0x0;
  if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start != &m) {
    piVar3 = (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start)->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if ((bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
          if ((bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start)->data != (void *)0x0) {
            free((bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start)->data);
          }
        }
        else {
          (*(bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
        }
      }
    }
    pMVar28->cstep = 0;
    pMVar28->data = (void *)0x0;
    pMVar28->refcount = (int *)0x0;
    *(undefined8 *)((long)&pMVar28->refcount + 4) = 0;
    *(undefined8 *)((long)&pMVar28->elemsize + 4) = 0;
    pMVar28->dims = 0;
    pMVar28->w = 0;
    pMVar28->h = 0;
    pMVar28->d = 0;
    pMVar28->c = 0;
    pMVar28->data = m.data;
    pMVar28->refcount = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    pMVar28->elemsize = CONCAT44(m.elemsize._4_4_,(int)m.elemsize);
    pMVar28->elempack = m.elempack;
    pMVar28->allocator = m.allocator;
    pMVar28->dims = m.dims;
    pMVar28->w = m.w;
    pMVar28->h = m.h;
    pMVar28->d = m.d;
    pMVar28->c = m.c;
    pMVar28->cstep = m.cstep;
  }
  piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (m.allocator == (Allocator *)0x0) {
        if (m.data != (void *)0x0) {
          free(m.data);
        }
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  Crop::eval_crop_expr
            (&this->super_Crop,&bottom_blob_shapes,&_woffset,&_hoffset,&_doffset,&_coffset,&_outw,
             &_outh,&_outd,&_outc);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&bottom_blob_shapes);
  pMVar34 = bottom_blob;
LAB_002891ac:
  iVar32 = (int)pMVar34;
  if (iVar2 == 8) {
    if ((int)local_a8 == 1) {
      uVar36 = _outw & 7;
      bVar40 = (_outw & 3U) == 0;
      iVar37 = 8;
      if (uVar36 != 0) {
        iVar37 = (uint)bVar40 * 3 + 1;
      }
      sVar31 = 3;
      if (uVar36 != 0) {
        sVar31 = bVar40 * '\x02';
      }
      if (_outw / iVar37 == local_128 && uVar36 == 0) {
        if (top_blob != bottom_blob) {
          piVar3 = bottom_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              pvVar4 = top_blob->data;
              pAVar5 = top_blob->allocator;
              if (pAVar5 == (Allocator *)0x0) {
                if (pvVar4 != (void *)0x0) {
                  free(pvVar4);
                }
              }
              else {
                (*pAVar5->_vptr_Allocator[3])(pAVar5,pvVar4,(long)_outw % (long)iVar37 & 0xffffffff)
                ;
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar3 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar3;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar32 = bottom_blob->w;
          iVar37 = bottom_blob->h;
          iVar29 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar32;
          top_blob->h = iVar37;
          top_blob->d = iVar29;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
LAB_00289350:
        bVar40 = false;
        iVar32 = 0;
      }
      else if (((_outw | _woffset) & 7U) == 0) {
        Mat::create(top_blob,_outw / iVar37,(local_b0 >> 3) << sVar31,8,opt->blob_allocator);
        iVar32 = -100;
        if (top_blob->data == (void *)0x0) {
          bVar40 = false;
        }
        else {
          bVar40 = false;
          if ((long)top_blob->c * top_blob->cstep != 0) {
            iVar32 = _woffset + 7;
            if (-1 < _woffset) {
              iVar32 = _woffset;
            }
            crop_pack8_avx(bottom_blob,top_blob,0,iVar32 >> 3);
            goto LAB_00289350;
          }
        }
      }
      else {
        bVar40 = true;
      }
      if (!bVar40) {
        return iVar32;
      }
    }
    if ((int)local_a8 == 2) {
      sVar31 = 3;
      if ((_outh & 7U) != 0) {
        sVar31 = ((_outh & 3U) == 0) * '\x02';
      }
      if (_outw == local_128) {
        iVar37 = 8;
        if ((_outh & 7U) != 0) {
          iVar37 = (uint)((_outh & 3U) == 0) * 3 + 1;
        }
        if (((_outh & 7U) != 0) || (_outh / iVar37 != uVar1)) goto LAB_00289413;
        if (top_blob != bottom_blob) {
          piVar3 = bottom_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              pvVar4 = top_blob->data;
              pAVar5 = top_blob->allocator;
              if (pAVar5 == (Allocator *)0x0) {
                if (pvVar4 != (void *)0x0) {
                  free(pvVar4);
                }
              }
              else {
                (*pAVar5->_vptr_Allocator[3])(pAVar5,pvVar4,(long)_outh % (long)iVar37 & 0xffffffff)
                ;
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar3 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar3;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar32 = bottom_blob->w;
          iVar37 = bottom_blob->h;
          iVar29 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar32;
          top_blob->h = iVar37;
          top_blob->d = iVar29;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
LAB_0028950d:
        bVar40 = false;
        iVar32 = 0;
      }
      else {
LAB_00289413:
        bVar40 = true;
        if (((_hoffset | _outh) & 7U) == 0) {
          iVar32 = _outh + 7;
          if (-1 < _outh) {
            iVar32 = _outh;
          }
          Mat::create(top_blob,_outw,iVar32 >> 3,(local_b0 >> 3) << sVar31,8,opt->blob_allocator);
          iVar32 = -100;
          if (top_blob->data == (void *)0x0) {
            bVar40 = false;
          }
          else {
            bVar40 = false;
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar32 = _hoffset + 7;
              if (-1 < _hoffset) {
                iVar32 = _hoffset;
              }
              crop_pack8_avx(bottom_blob,top_blob,iVar32 >> 3,_woffset);
              goto LAB_0028950d;
            }
          }
        }
      }
      if (!bVar40) {
        return iVar32;
      }
    }
    if ((int)local_a8 == 3) {
      uVar38 = local_b0 >> 3;
      sVar31 = 3;
      if ((_outc & 7U) != 0) {
        sVar31 = ((_outc & 3U) == 0) * '\x02';
      }
      uVar36 = _outh ^ uVar1 | _outw ^ local_128;
      bVar40 = uVar36 == 0;
      if (bVar40) {
        iVar37 = 8;
        if ((_outc & 7U) != 0) {
          iVar37 = (uint)((_outc & 3U) == 0) * 3 + 1;
        }
        if (((_outc & 7U) != 0) || (_outc / iVar37 != local_9c)) goto LAB_002895e8;
        if (top_blob != bottom_blob) {
          piVar3 = bottom_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              pvVar4 = top_blob->data;
              pAVar5 = top_blob->allocator;
              if (pAVar5 == (Allocator *)0x0) {
                if (pvVar4 != (void *)0x0) {
                  free(pvVar4);
                }
              }
              else {
                (*pAVar5->_vptr_Allocator[3])(pAVar5,pvVar4,(long)_outc % (long)iVar37 & 0xffffffff)
                ;
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar3 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar3;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar32 = bottom_blob->w;
          iVar37 = bottom_blob->h;
          iVar29 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar32;
          top_blob->h = iVar37;
          top_blob->d = iVar29;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
        bVar41 = false;
        iVar32 = 0;
      }
      else {
LAB_002895e8:
        bVar41 = true;
        if (((_coffset | _outc) & 7U) == 0) {
          iVar32 = _coffset + 7;
          if (-1 < _coffset) {
            iVar32 = _coffset;
          }
          iVar37 = _outc + 7;
          if (-1 < _outc) {
            iVar37 = _outc;
          }
          m.c = iVar37 >> 3;
          uVar6 = bottom_blob->elemsize;
          m.data = (void *)((long)(iVar32 >> 3) * bottom_blob->cstep * uVar6 +
                           (long)bottom_blob->data);
          m.elempack = bottom_blob->elempack;
          m.allocator = bottom_blob->allocator;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = (int)uVar6;
          m.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
          uVar7 = bottom_blob->dims;
          uVar8 = bottom_blob->w;
          uVar9 = bottom_blob->h;
          uVar10 = bottom_blob->d;
          m.cstep = ((long)bottom_blob->d * uVar6 * (long)bottom_blob->h * (long)bottom_blob->w +
                     0xf & 0xfffffffffffffff0) / uVar6;
          m.dims = uVar7;
          m.w = uVar8;
          m.h = uVar9;
          m.d = uVar10;
          if (bVar40) {
            Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,opt->blob_allocator,
                       CONCAT31((int3)(uVar36 >> 8),bVar40),m.allocator);
            if ((Mat *)&bottom_blob_shapes != top_blob) {
              piVar3 = (int *)CONCAT44(bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                       bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._0_4_);
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + 1;
                UNLOCK();
              }
              piVar3 = top_blob->refcount;
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + -1;
                UNLOCK();
                if (*piVar3 == 0) {
                  if (top_blob->allocator == (Allocator *)0x0) {
                    if (top_blob->data != (void *)0x0) {
                      free(top_blob->data);
                    }
                  }
                  else {
                    (*top_blob->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              top_blob->cstep = 0;
              top_blob->data = (void *)0x0;
              top_blob->refcount = (int *)0x0;
              *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
              *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
              top_blob->dims = 0;
              top_blob->w = 0;
              top_blob->h = 0;
              top_blob->d = 0;
              top_blob->c = 0;
              top_blob->data =
                   bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              top_blob->refcount =
                   (int *)CONCAT44(bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._4_4_,
                                   bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._0_4_);
              top_blob->elemsize =
                   CONCAT44(bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_,
                            (int)bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
              top_blob->elempack = iStack_100;
              top_blob->allocator = local_f8;
              top_blob->dims = (int)uStack_f0;
              top_blob->w = uStack_f0._4_4_;
              top_blob->h = iStack_e8;
              top_blob->d = iStack_e4;
              top_blob->c = iStack_e0;
              top_blob->cstep = local_d8;
            }
            piVar3 = (int *)CONCAT44(bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._0_4_);
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (local_f8 == (Allocator *)0x0) {
                  if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    free(bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_start);
                  }
                }
                else {
                  (*local_f8->_vptr_Allocator[3])();
                }
              }
            }
            iVar32 = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
            goto LAB_00289864;
          }
          else {
LAB_00289864:
            iVar32 = _outc + 7;
            if (-1 < _outc) {
              iVar32 = _outc;
            }
            Mat::create(top_blob,_outw,_outh,iVar32 >> 3,uVar38 << sVar31,8,opt->blob_allocator);
            iVar32 = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
              if (top_blob->c < 1) {
                iVar32 = 0;
              }
              else {
                lVar39 = 0;
                do {
                  pAVar5 = m.allocator;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)(m.cstep * lVar39 * CONCAT44(m.elemsize._4_4_,(int)m.elemsize) +
                                (long)m.data);
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (int)m.elemsize;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = m.elemsize._4_4_;
                  local_f8 = m.allocator;
                  m_2.h = top_blob->h;
                  m_2.c = top_blob->d;
                  uVar38 = top_blob->elemsize;
                  m_2.data = (void *)(top_blob->cstep * lVar39 * uVar38 + (long)top_blob->data);
                  m_2.elempack = top_blob->elempack;
                  m_2.allocator = top_blob->allocator;
                  m_2.refcount._0_4_ = 0;
                  m_2.refcount._4_4_ = 0;
                  m_2.elemsize._0_4_ = (undefined4)uVar38;
                  m_2.elemsize._4_4_ = (undefined4)(uVar38 >> 0x20);
                  m_2.d = 1;
                  sVar33 = (long)m_2.h * (long)top_blob->w;
                  m_2.w = top_blob->w;
                  m_2.dims = top_blob->dims + -1;
                  m_2.cstep = (uVar38 * sVar33 + 0xf & 0xfffffffffffffff0) / uVar38;
                  if (top_blob->dims == 4) {
                    m_2.cstep = sVar33;
                  }
                  crop_pack8_avx((Mat *)&bottom_blob_shapes,&m_2,_hoffset,_woffset);
                  m_2.cstep = 0;
                  m_2.data = (void *)0x0;
                  m_2.refcount._0_4_ = 0;
                  m_2.refcount._4_4_ = 0;
                  m_2.elemsize._0_4_ = 0;
                  m_2.elemsize._4_4_ = 0;
                  m_2.elempack = 0;
                  m_2.dims = 0;
                  m_2.w = 0;
                  m_2.h = 0;
                  m_2.d = 0;
                  m_2.c = 0;
                  piVar3 = (int *)CONCAT44(bottom_blob_shapes.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                           bottom_blob_shapes.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._0_4_);
                  if (piVar3 != (int *)0x0) {
                    LOCK();
                    *piVar3 = *piVar3 + -1;
                    UNLOCK();
                    if (*piVar3 == 0) {
                      if (pAVar5 == (Allocator *)0x0) {
                        if (bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start != (pointer)0x0) {
                          free(bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_start);
                        }
                      }
                      else {
                        (*pAVar5->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_d8 = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                  iStack_100 = 0;
                  uStack_f0._0_4_ = 0;
                  uStack_f0._4_4_ = 0;
                  iStack_e8 = 0;
                  iStack_e4 = 0;
                  iStack_e0 = 0;
                  lVar39 = lVar39 + 1;
                } while (lVar39 < top_blob->c);
                iVar32 = 0;
              }
            }
          }
          piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (m.allocator == (Allocator *)0x0) {
                if (m.data != (void *)0x0) {
                  free(m.data);
                }
              }
              else {
                (*(m.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m.cstep = 0;
          m.data = (void *)0x0;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = 0;
          m.elemsize._4_4_ = 0;
          m.elempack = 0;
          m.dims = 0;
          m.w = 0;
          m.h = 0;
          m.d = 0;
          m.c = 0;
          bVar41 = false;
        }
      }
      if (!bVar41) {
        return iVar32;
      }
    }
    if ((int)local_a8 == 4) {
      uVar38 = local_b0 >> 3;
      sVar31 = 3;
      if ((_outc & 7U) != 0) {
        sVar31 = ((_outc & 3U) == 0) * '\x02';
      }
      uVar36 = _outh ^ uVar1 | _outw ^ local_128;
      bVar40 = _outd == iVar30;
      bVar41 = uVar36 == 0;
      if (bVar40 && bVar41) {
        iVar37 = 8;
        if ((_outc & 7U) != 0) {
          iVar37 = (uint)((_outc & 3U) == 0) * 3 + 1;
        }
        if (((_outc & 7U) != 0) || (_outc / iVar37 != local_9c)) goto LAB_00289c97;
        if (top_blob != bottom_blob) {
          piVar3 = bottom_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              pvVar4 = top_blob->data;
              pAVar5 = top_blob->allocator;
              if (pAVar5 == (Allocator *)0x0) {
                if (pvVar4 != (void *)0x0) {
                  free(pvVar4);
                }
              }
              else {
                (*pAVar5->_vptr_Allocator[3])(pAVar5,pvVar4,(long)_outc % (long)iVar37 & 0xffffffff)
                ;
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar3 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar3;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar32 = bottom_blob->w;
          iVar37 = bottom_blob->h;
          iVar29 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar32;
          top_blob->h = iVar37;
          top_blob->d = iVar29;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
        bVar27 = false;
        iVar32 = 0;
      }
      else {
LAB_00289c97:
        bVar27 = true;
        if (((_coffset | _outc) & 7U) == 0) {
          iVar32 = _coffset + 7;
          if (-1 < _coffset) {
            iVar32 = _coffset;
          }
          iVar37 = _outc + 7;
          if (-1 < _outc) {
            iVar37 = _outc;
          }
          m.c = iVar37 >> 3;
          uVar6 = bottom_blob->elemsize;
          m.data = (void *)((long)(iVar32 >> 3) * bottom_blob->cstep * uVar6 +
                           (long)bottom_blob->data);
          m.elempack = bottom_blob->elempack;
          m.allocator = bottom_blob->allocator;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = (int)uVar6;
          m.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
          uVar19 = bottom_blob->dims;
          uVar20 = bottom_blob->w;
          uVar21 = bottom_blob->h;
          uVar22 = bottom_blob->d;
          m.cstep = ((long)bottom_blob->d * uVar6 * (long)bottom_blob->h * (long)bottom_blob->w +
                     0xf & 0xfffffffffffffff0) / uVar6;
          m.dims = uVar19;
          m.w = uVar20;
          m.h = uVar21;
          m.d = uVar22;
          if (bVar40 && bVar41) {
            Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,opt->blob_allocator,
                       CONCAT31((int3)(uVar36 >> 8),bVar40 && bVar41),m.allocator);
            if ((Mat *)&bottom_blob_shapes != top_blob) {
              piVar3 = (int *)CONCAT44(bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                       bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._0_4_);
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + 1;
                UNLOCK();
              }
              piVar3 = top_blob->refcount;
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + -1;
                UNLOCK();
                if (*piVar3 == 0) {
                  if (top_blob->allocator == (Allocator *)0x0) {
                    if (top_blob->data != (void *)0x0) {
                      free(top_blob->data);
                    }
                  }
                  else {
                    (*top_blob->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              top_blob->cstep = 0;
              top_blob->data = (void *)0x0;
              top_blob->refcount = (int *)0x0;
              *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
              *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
              top_blob->dims = 0;
              top_blob->w = 0;
              top_blob->h = 0;
              top_blob->d = 0;
              top_blob->c = 0;
              top_blob->data =
                   bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              top_blob->refcount =
                   (int *)CONCAT44(bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._4_4_,
                                   bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._0_4_);
              top_blob->elemsize =
                   CONCAT44(bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_,
                            (int)bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
              top_blob->elempack = iStack_100;
              top_blob->allocator = local_f8;
              top_blob->dims = (int)uStack_f0;
              top_blob->w = uStack_f0._4_4_;
              top_blob->h = iStack_e8;
              top_blob->d = iStack_e4;
              top_blob->c = iStack_e0;
              top_blob->cstep = local_d8;
            }
            piVar3 = (int *)CONCAT44(bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._0_4_);
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (local_f8 == (Allocator *)0x0) {
                  if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    free(bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_start);
                  }
                }
                else {
                  (*local_f8->_vptr_Allocator[3])();
                }
              }
            }
            iVar32 = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
            goto LAB_00289f13;
          }
          else {
LAB_00289f13:
            iVar32 = _outc + 7;
            if (-1 < _outc) {
              iVar32 = _outc;
            }
            Mat::create(top_blob,_outw,_outh,_outd,iVar32 >> 3,uVar38 << sVar31,8,
                        opt->blob_allocator);
            iVar32 = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
              if (top_blob->c < 1) {
                iVar32 = 0;
              }
              else {
                lVar39 = 0;
                do {
                  if (0 < _outd) {
                    lVar35 = 0;
                    do {
                      pAVar5 = m.allocator;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start =
                           (pointer)((long)m.data +
                                    (long)(_doffset + (int)lVar35) *
                                    CONCAT44(m.elemsize._4_4_,(int)m.elemsize) *
                                    (long)m.h * (long)m.w +
                                    m.cstep * lVar39 * CONCAT44(m.elemsize._4_4_,(int)m.elemsize));
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (int)m.elemsize;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = m.elemsize._4_4_;
                      local_f8 = m.allocator;
                      m_2.h = top_blob->h;
                      sVar33 = top_blob->elemsize;
                      m_2.elempack = top_blob->elempack;
                      m_2.allocator = top_blob->allocator;
                      m_2.cstep = (long)m_2.h * (long)top_blob->w;
                      m_2.data = (void *)((long)top_blob->data +
                                         lVar35 * sVar33 * m_2.cstep +
                                         top_blob->cstep * lVar39 * sVar33);
                      m_2.refcount._0_4_ = 0;
                      m_2.refcount._4_4_ = 0;
                      m_2.elemsize._0_4_ = (undefined4)sVar33;
                      m_2.elemsize._4_4_ = (undefined4)(sVar33 >> 0x20);
                      m_2.w = top_blob->w;
                      m_2.dims = 2;
                      m_2.d = 1;
                      m_2.c = 1;
                      crop_pack8_avx((Mat *)&bottom_blob_shapes,&m_2,_hoffset,_woffset);
                      piVar3 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
                      if (piVar3 != (int *)0x0) {
                        LOCK();
                        *piVar3 = *piVar3 + -1;
                        UNLOCK();
                        if (*piVar3 == 0) {
                          if (m_2.allocator == (Allocator *)0x0) {
                            if (m_2.data != (void *)0x0) {
                              free(m_2.data);
                            }
                          }
                          else {
                            (*(m_2.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                      m_2.cstep = 0;
                      m_2.data = (void *)0x0;
                      m_2.refcount._0_4_ = 0;
                      m_2.refcount._4_4_ = 0;
                      m_2.elemsize._0_4_ = 0;
                      m_2.elemsize._4_4_ = 0;
                      m_2.elempack = 0;
                      m_2.dims = 0;
                      m_2.w = 0;
                      m_2.h = 0;
                      m_2.d = 0;
                      m_2.c = 0;
                      piVar3 = (int *)CONCAT44(bottom_blob_shapes.
                                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                               ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                               bottom_blob_shapes.
                                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                               ._M_impl.super__Vector_impl_data._M_finish._0_4_);
                      if (piVar3 != (int *)0x0) {
                        LOCK();
                        *piVar3 = *piVar3 + -1;
                        UNLOCK();
                        if (*piVar3 == 0) {
                          if (pAVar5 == (Allocator *)0x0) {
                            if (bottom_blob_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_start != (pointer)0x0) {
                              free(bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_start);
                            }
                          }
                          else {
                            (*pAVar5->_vptr_Allocator[3])();
                          }
                        }
                      }
                      local_d8 = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                      iStack_100 = 0;
                      uStack_f0._0_4_ = 0;
                      uStack_f0._4_4_ = 0;
                      iStack_e8 = 0;
                      iStack_e4 = 0;
                      iStack_e0 = 0;
                      lVar35 = lVar35 + 1;
                    } while (lVar35 < _outd);
                  }
                  lVar39 = lVar39 + 1;
                } while (lVar39 < top_blob->c);
                iVar32 = 0;
              }
            }
          }
          piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (m.allocator == (Allocator *)0x0) {
                if (m.data != (void *)0x0) {
                  free(m.data);
                }
              }
              else {
                (*(m.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m.cstep = 0;
          m.data = (void *)0x0;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = 0;
          m.elemsize._4_4_ = 0;
          m.elempack = 0;
          m.dims = 0;
          m.w = 0;
          m.h = 0;
          m.d = 0;
          m.c = 0;
          bVar27 = false;
        }
      }
      if (!bVar27) {
        return iVar32;
      }
    }
  }
  if (iVar2 == 4) {
    if ((int)local_a8 == 1) {
      uVar36 = _outw & 3;
      iVar37 = (uint)(uVar36 == 0) * 3 + 1;
      if (_outw / iVar37 == local_128 && uVar36 == 0) {
        if (top_blob != bottom_blob) {
          piVar3 = bottom_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              pvVar4 = top_blob->data;
              pAVar5 = top_blob->allocator;
              if (pAVar5 == (Allocator *)0x0) {
                if (pvVar4 != (void *)0x0) {
                  free(pvVar4);
                }
              }
              else {
                (*pAVar5->_vptr_Allocator[3])(pAVar5,pvVar4,(long)_outw % (long)iVar37 & 0xffffffff)
                ;
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar3 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar3;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar32 = bottom_blob->w;
          iVar37 = bottom_blob->h;
          iVar29 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar32;
          top_blob->h = iVar37;
          top_blob->d = iVar29;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
LAB_0028a3eb:
        bVar40 = false;
        iVar32 = 0;
      }
      else {
        bVar40 = true;
        if (((_outw | _woffset) & 3U) == 0) {
          Mat::create(top_blob,_outw / iVar37,(local_b0 >> 2) << (uVar36 == 0) * '\x02',iVar37,
                      opt->blob_allocator);
          iVar32 = -100;
          if (top_blob->data == (void *)0x0) {
            bVar40 = false;
          }
          else {
            bVar40 = false;
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar32 = _woffset + 3;
              if (-1 < _woffset) {
                iVar32 = _woffset;
              }
              crop_pack4_sse(bottom_blob,top_blob,0,iVar32 >> 2);
              goto LAB_0028a3eb;
            }
          }
        }
      }
      if (!bVar40) {
        return iVar32;
      }
    }
    if ((int)local_a8 == 2) {
      bVar40 = (_outh & 3U) == 0;
      iVar37 = (uint)bVar40 * 3 + 1;
      if (_outw == local_128) {
        if (((_outh & 3U) != 0) || (_outh / iVar37 != uVar1)) goto LAB_0028a48c;
        if (top_blob != bottom_blob) {
          piVar3 = bottom_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              pvVar4 = top_blob->data;
              pAVar5 = top_blob->allocator;
              if (pAVar5 == (Allocator *)0x0) {
                if (pvVar4 != (void *)0x0) {
                  free(pvVar4);
                }
              }
              else {
                (*pAVar5->_vptr_Allocator[3])(pAVar5,pvVar4,(long)_outh % (long)iVar37 & 0xffffffff)
                ;
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar3 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar3;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar32 = bottom_blob->w;
          iVar37 = bottom_blob->h;
          iVar29 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar32;
          top_blob->h = iVar37;
          top_blob->d = iVar29;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
LAB_0028a57d:
        bVar41 = false;
        iVar32 = 0;
      }
      else {
LAB_0028a48c:
        bVar41 = true;
        if (((_hoffset | _outh) & 3U) == 0) {
          Mat::create(top_blob,_outw,_outh / iVar37,(local_b0 >> 2) << bVar40 * '\x02',iVar37,
                      opt->blob_allocator);
          iVar32 = -100;
          if (top_blob->data == (void *)0x0) {
            bVar41 = false;
          }
          else {
            bVar41 = false;
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar32 = _hoffset + 3;
              if (-1 < _hoffset) {
                iVar32 = _hoffset;
              }
              crop_pack4_sse(bottom_blob,top_blob,iVar32 >> 2,_woffset);
              goto LAB_0028a57d;
            }
          }
        }
      }
      if (!bVar41) {
        return iVar32;
      }
    }
    if ((int)local_a8 == 3) {
      bVar40 = (_outc & 3U) == 0;
      iVar37 = (uint)bVar40 * 3 + 1;
      uVar38 = local_b0 >> 2;
      bVar41 = _outh != uVar1 || _outw != local_128;
      if (bVar41) {
LAB_0028a63b:
        bVar27 = true;
        if (((_coffset | _outc) & 3U) == 0) {
          m.c = _outc / iVar37;
          uVar6 = bottom_blob->elemsize;
          m.data = (void *)((long)(_coffset / iVar37) * bottom_blob->cstep * uVar6 +
                           (long)bottom_blob->data);
          m.elempack = bottom_blob->elempack;
          m.allocator = bottom_blob->allocator;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = (int)uVar6;
          m.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
          uVar11 = bottom_blob->dims;
          uVar12 = bottom_blob->w;
          uVar13 = bottom_blob->h;
          uVar14 = bottom_blob->d;
          m.cstep = ((long)bottom_blob->d * uVar6 * (long)bottom_blob->h * (long)bottom_blob->w +
                     0xf & 0xfffffffffffffff0) / uVar6;
          m.dims = uVar11;
          m.w = uVar12;
          m.h = uVar13;
          m.d = uVar14;
          if (bVar41) {
LAB_0028a8ae:
            Mat::create(top_blob,_outw,_outh,_outc / iVar37,uVar38 << bVar40 * '\x02',iVar37,
                        opt->blob_allocator);
            iVar32 = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
              if (top_blob->c < 1) {
                iVar32 = 0;
              }
              else {
                lVar39 = 0;
                do {
                  pAVar5 = m.allocator;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)(m.cstep * lVar39 * CONCAT44(m.elemsize._4_4_,(int)m.elemsize) +
                                (long)m.data);
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (int)m.elemsize;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = m.elemsize._4_4_;
                  local_f8 = m.allocator;
                  m_2.h = top_blob->h;
                  m_2.c = top_blob->d;
                  uVar38 = top_blob->elemsize;
                  m_2.data = (void *)(top_blob->cstep * lVar39 * uVar38 + (long)top_blob->data);
                  m_2.elempack = top_blob->elempack;
                  m_2.allocator = top_blob->allocator;
                  m_2.refcount._0_4_ = 0;
                  m_2.refcount._4_4_ = 0;
                  m_2.elemsize._0_4_ = (undefined4)uVar38;
                  m_2.elemsize._4_4_ = (undefined4)(uVar38 >> 0x20);
                  m_2.d = 1;
                  sVar33 = (long)m_2.h * (long)top_blob->w;
                  m_2.w = top_blob->w;
                  m_2.dims = top_blob->dims + -1;
                  m_2.cstep = (uVar38 * sVar33 + 0xf & 0xfffffffffffffff0) / uVar38;
                  if (top_blob->dims == 4) {
                    m_2.cstep = sVar33;
                  }
                  crop_pack4_sse((Mat *)&bottom_blob_shapes,&m_2,_hoffset,_woffset);
                  m_2.cstep = 0;
                  m_2.data = (void *)0x0;
                  m_2.refcount._0_4_ = 0;
                  m_2.refcount._4_4_ = 0;
                  m_2.elemsize._0_4_ = 0;
                  m_2.elemsize._4_4_ = 0;
                  m_2.elempack = 0;
                  m_2.dims = 0;
                  m_2.w = 0;
                  m_2.h = 0;
                  m_2.d = 0;
                  m_2.c = 0;
                  piVar3 = (int *)CONCAT44(bottom_blob_shapes.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                           bottom_blob_shapes.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._0_4_);
                  if (piVar3 != (int *)0x0) {
                    LOCK();
                    *piVar3 = *piVar3 + -1;
                    UNLOCK();
                    if (*piVar3 == 0) {
                      if (pAVar5 == (Allocator *)0x0) {
                        if (bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start != (pointer)0x0) {
                          free(bottom_blob_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_start);
                        }
                      }
                      else {
                        (*pAVar5->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_d8 = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                  bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                  iStack_100 = 0;
                  uStack_f0._0_4_ = 0;
                  uStack_f0._4_4_ = 0;
                  iStack_e8 = 0;
                  iStack_e4 = 0;
                  iStack_e0 = 0;
                  lVar39 = lVar39 + 1;
                } while (lVar39 < top_blob->c);
                iVar32 = 0;
              }
            }
          }
          else {
            Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,opt->blob_allocator,(int)m.elemsize,
                       m.allocator);
            if ((Mat *)&bottom_blob_shapes != top_blob) {
              piVar3 = (int *)CONCAT44(bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                       bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._0_4_);
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + 1;
                UNLOCK();
              }
              piVar3 = top_blob->refcount;
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + -1;
                UNLOCK();
                if (*piVar3 == 0) {
                  if (top_blob->allocator == (Allocator *)0x0) {
                    if (top_blob->data != (void *)0x0) {
                      free(top_blob->data);
                    }
                  }
                  else {
                    (*top_blob->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              top_blob->cstep = 0;
              top_blob->data = (void *)0x0;
              top_blob->refcount = (int *)0x0;
              *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
              *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
              top_blob->dims = 0;
              top_blob->w = 0;
              top_blob->h = 0;
              top_blob->d = 0;
              top_blob->c = 0;
              top_blob->data =
                   bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              top_blob->refcount =
                   (int *)CONCAT44(bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._4_4_,
                                   bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._0_4_);
              top_blob->elemsize =
                   CONCAT44(bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_,
                            (int)bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
              top_blob->elempack = iStack_100;
              top_blob->allocator = local_f8;
              top_blob->dims = (int)uStack_f0;
              top_blob->w = uStack_f0._4_4_;
              top_blob->h = iStack_e8;
              top_blob->d = iStack_e4;
              top_blob->c = iStack_e0;
              top_blob->cstep = local_d8;
            }
            piVar3 = (int *)CONCAT44(bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._0_4_);
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (local_f8 == (Allocator *)0x0) {
                  if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    free(bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_start);
                  }
                }
                else {
                  (*local_f8->_vptr_Allocator[3])();
                }
              }
            }
            iVar32 = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
            goto LAB_0028a8ae;
          }
          piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (m.allocator == (Allocator *)0x0) {
                if (m.data != (void *)0x0) {
                  free(m.data);
                }
              }
              else {
                (*(m.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m.cstep = 0;
          m.data = (void *)0x0;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = 0;
          m.elemsize._4_4_ = 0;
          m.elempack = 0;
          m.dims = 0;
          m.w = 0;
          m.h = 0;
          m.d = 0;
          m.c = 0;
          bVar27 = false;
        }
      }
      else {
        if (((_outc & 3U) != 0) || (_outc / iVar37 != local_9c)) goto LAB_0028a63b;
        if (top_blob != bottom_blob) {
          piVar3 = bottom_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              pvVar4 = top_blob->data;
              pAVar5 = top_blob->allocator;
              if (pAVar5 == (Allocator *)0x0) {
                if (pvVar4 != (void *)0x0) {
                  free(pvVar4);
                }
              }
              else {
                (*pAVar5->_vptr_Allocator[3])(pAVar5,pvVar4,(long)_outc % (long)iVar37 & 0xffffffff)
                ;
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar3 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar3;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar32 = bottom_blob->w;
          iVar37 = bottom_blob->h;
          iVar29 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar32;
          top_blob->h = iVar37;
          top_blob->d = iVar29;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
        bVar27 = false;
        iVar32 = 0;
      }
      if (!bVar27) {
        return iVar32;
      }
    }
    if ((int)local_a8 == 4) {
      bVar40 = (_outc & 3U) == 0;
      iVar37 = (uint)bVar40 * 3 + 1;
      local_b0 = (local_b0 >> 2) << bVar40 * '\x02';
      bVar40 = iVar30 != _outd || (uVar1 != _outh || local_128 != _outw);
      if (bVar40) {
LAB_0028acc6:
        bVar41 = true;
        if (((_coffset | _outc) & 3U) == 0) {
          m.c = _outc / iVar37;
          uVar38 = bottom_blob->elemsize;
          m.data = (void *)((long)(_coffset / iVar37) * bottom_blob->cstep * uVar38 +
                           (long)bottom_blob->data);
          m.elempack = bottom_blob->elempack;
          m.allocator = bottom_blob->allocator;
          m.refcount._0_4_ = 0;
          m.refcount._4_4_ = 0;
          m.elemsize._0_4_ = (int)uVar38;
          m.elemsize._4_4_ = (undefined4)(uVar38 >> 0x20);
          uVar23 = bottom_blob->dims;
          uVar24 = bottom_blob->w;
          uVar25 = bottom_blob->h;
          uVar26 = bottom_blob->d;
          m.cstep = ((long)bottom_blob->d * uVar38 * (long)bottom_blob->h * (long)bottom_blob->w +
                     0xf & 0xfffffffffffffff0) / uVar38;
          m.dims = uVar23;
          m.w = uVar24;
          m.h = uVar25;
          m.d = uVar26;
          if (bVar40) {
LAB_0028af39:
            Mat::create(top_blob,_outw,_outh,_outd,_outc / iVar37,local_b0,iVar37,
                        opt->blob_allocator);
            iVar32 = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
              if (top_blob->c < 1) {
                iVar32 = 0;
              }
              else {
                lVar39 = 0;
                do {
                  if (0 < _outd) {
                    lVar35 = 0;
                    do {
                      pAVar5 = m.allocator;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start =
                           (pointer)((long)m.data +
                                    (long)(_doffset + (int)lVar35) *
                                    CONCAT44(m.elemsize._4_4_,(int)m.elemsize) *
                                    (long)m.h * (long)m.w +
                                    m.cstep * lVar39 * CONCAT44(m.elemsize._4_4_,(int)m.elemsize));
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (int)m.elemsize;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = m.elemsize._4_4_;
                      m_2.h = top_blob->h;
                      sVar33 = top_blob->elemsize;
                      m_2.elempack = top_blob->elempack;
                      m_2.allocator = top_blob->allocator;
                      m_2.cstep = (long)m_2.h * (long)top_blob->w;
                      m_2.data = (void *)((long)top_blob->data +
                                         lVar35 * sVar33 * m_2.cstep +
                                         top_blob->cstep * lVar39 * sVar33);
                      m_2.refcount._0_4_ = 0;
                      m_2.refcount._4_4_ = 0;
                      m_2.elemsize._0_4_ = (undefined4)sVar33;
                      m_2.elemsize._4_4_ = (undefined4)(sVar33 >> 0x20);
                      m_2.w = top_blob->w;
                      m_2.dims = 2;
                      m_2.d = 1;
                      m_2.c = 1;
                      crop_pack4_sse((Mat *)&bottom_blob_shapes,&m_2,_hoffset,_woffset);
                      piVar3 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
                      if (piVar3 != (int *)0x0) {
                        LOCK();
                        *piVar3 = *piVar3 + -1;
                        UNLOCK();
                        if (*piVar3 == 0) {
                          if (m_2.allocator == (Allocator *)0x0) {
                            if (m_2.data != (void *)0x0) {
                              free(m_2.data);
                            }
                          }
                          else {
                            (*(m_2.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                      m_2.cstep = 0;
                      m_2.data = (void *)0x0;
                      m_2.refcount._0_4_ = 0;
                      m_2.refcount._4_4_ = 0;
                      m_2.elemsize._0_4_ = 0;
                      m_2.elemsize._4_4_ = 0;
                      m_2.elempack = 0;
                      m_2.dims = 0;
                      m_2.w = 0;
                      m_2.h = 0;
                      m_2.d = 0;
                      m_2.c = 0;
                      piVar3 = (int *)CONCAT44(bottom_blob_shapes.
                                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                               ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                               bottom_blob_shapes.
                                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                               ._M_impl.super__Vector_impl_data._M_finish._0_4_);
                      if (piVar3 != (int *)0x0) {
                        LOCK();
                        *piVar3 = *piVar3 + -1;
                        UNLOCK();
                        if (*piVar3 == 0) {
                          if (pAVar5 == (Allocator *)0x0) {
                            if (bottom_blob_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_start != (pointer)0x0) {
                              free(bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_start);
                            }
                          }
                          else {
                            (*pAVar5->_vptr_Allocator[3])();
                          }
                        }
                      }
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                      bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                      lVar35 = lVar35 + 1;
                    } while (lVar35 < _outd);
                  }
                  lVar39 = lVar39 + 1;
                } while (lVar39 < top_blob->c);
                iVar32 = 0;
              }
            }
          }
          else {
            Mat::clone((Mat *)&bottom_blob_shapes,(__fn *)&m,opt->blob_allocator,(int)m.elemsize,
                       m.allocator);
            if ((Mat *)&bottom_blob_shapes != top_blob) {
              piVar3 = (int *)CONCAT44(bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                       bottom_blob_shapes.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_finish._0_4_);
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + 1;
                UNLOCK();
              }
              piVar3 = top_blob->refcount;
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + -1;
                UNLOCK();
                if (*piVar3 == 0) {
                  if (top_blob->allocator == (Allocator *)0x0) {
                    if (top_blob->data != (void *)0x0) {
                      free(top_blob->data);
                    }
                  }
                  else {
                    (*top_blob->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              top_blob->cstep = 0;
              top_blob->data = (void *)0x0;
              top_blob->refcount = (int *)0x0;
              *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
              *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
              top_blob->dims = 0;
              top_blob->w = 0;
              top_blob->h = 0;
              top_blob->d = 0;
              top_blob->c = 0;
              top_blob->data =
                   bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              top_blob->refcount =
                   (int *)CONCAT44(bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._4_4_,
                                   bottom_blob_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_finish._0_4_);
              top_blob->elemsize =
                   CONCAT44(bottom_blob_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_,
                            (int)bottom_blob_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
              top_blob->elempack = iStack_100;
              top_blob->allocator = local_f8;
              top_blob->dims = (int)uStack_f0;
              top_blob->w = uStack_f0._4_4_;
              top_blob->h = iStack_e8;
              top_blob->d = iStack_e4;
              top_blob->c = iStack_e0;
              top_blob->cstep = local_d8;
            }
            piVar3 = (int *)CONCAT44(bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                     bottom_blob_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._0_4_);
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (local_f8 == (Allocator *)0x0) {
                  if (bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    free(bottom_blob_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_start);
                  }
                }
                else {
                  (*local_f8->_vptr_Allocator[3])();
                }
              }
            }
            iVar32 = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
            goto LAB_0028af39;
          }
          piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (m.allocator == (Allocator *)0x0) {
                if (m.data != (void *)0x0) {
                  free(m.data);
                }
              }
              else {
                (*(m.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          bVar41 = false;
        }
      }
      else {
        if (((_outc & 3U) != 0) || (_outc / iVar37 != local_9c)) goto LAB_0028acc6;
        if (top_blob != bottom_blob) {
          piVar3 = bottom_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              pvVar4 = top_blob->data;
              pAVar5 = top_blob->allocator;
              if (pAVar5 == (Allocator *)0x0) {
                if (pvVar4 != (void *)0x0) {
                  free(pvVar4);
                }
              }
              else {
                (*pAVar5->_vptr_Allocator[3])(pAVar5,pvVar4,(long)_outc % (long)iVar37 & 0xffffffff)
                ;
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar3 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar3;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar30 = bottom_blob->w;
          iVar32 = bottom_blob->h;
          iVar37 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar30;
          top_blob->h = iVar32;
          top_blob->d = iVar37;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
        bVar41 = false;
        iVar32 = 0;
      }
      if (!bVar41) {
        return iVar32;
      }
    }
  }
  piVar3 = bottom_blob->refcount;
  m.data = bottom_blob->data;
  m.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
  m.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  m.elemsize._0_4_ = (int)bottom_blob->elemsize;
  m.elemsize._4_4_ = (undefined4)(bottom_blob->elemsize >> 0x20);
  m.elempack = bottom_blob->elempack;
  m.allocator = bottom_blob->allocator;
  uVar15 = bottom_blob->dims;
  uVar16 = bottom_blob->w;
  uVar17 = bottom_blob->h;
  uVar18 = bottom_blob->d;
  m.c = bottom_blob->c;
  m.cstep = bottom_blob->cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  m.dims = uVar15;
  m.w = uVar16;
  m.h = uVar17;
  m.d = uVar18;
  if (iVar2 != 1) {
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start = *(pointer *)opt;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = (int)opt->workspace_allocator;
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = SUB84(opt->workspace_allocator,0);
    bottom_blob_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    convert_packing(bottom_blob,&m,1,(Option *)&bottom_blob_shapes);
    if (m.data == (void *)0x0 || (long)m.c * m.cstep == 0) {
      iVar30 = -100;
      goto LAB_0028b364;
    }
  }
  iVar30 = Crop::forward(&this->super_Crop,&m,top_blob,opt);
LAB_0028b364:
  piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (m.allocator == (Allocator *)0x0) {
        if (m.data != (void *)0x0) {
          free(m.data);
        }
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar30;
}

Assistant:

int Crop_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
    int _woffset, _hoffset, _doffset, _coffset;
    int _outw, _outh, _outd, _outc;
    if (!starts_expr.empty() && !ends_expr.empty())
    {
        std::vector<Mat> bottom_blob_shapes(1);
        bottom_blob_shapes[0] = bottom_blob.shape();
        eval_crop_expr(bottom_blob_shapes, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else
    {
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 16 == 0 ? 16 : _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 16 == 0 ? 16 : _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
        if (bottom_blob_unpacked.empty())
            return -100;
    }

    return Crop::forward(bottom_blob_unpacked, top_blob, opt);
}